

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O2

void * ngx_slab_alloc_locked(ngx_slab_pool_t *pool,size_t size)

{
  ngx_uint_t *pnVar1;
  ulong *puVar2;
  ulong *puVar3;
  u_char *puVar4;
  ngx_slab_stat_t *pnVar5;
  byte bVar6;
  ngx_slab_page_t *pnVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ngx_slab_stat_t *pnVar12;
  ulong uVar13;
  ulong uVar14;
  ngx_slab_page_t *pnVar15;
  ulong uVar16;
  size_t sVar17;
  u_char *puVar18;
  long lVar19;
  long lVar20;
  
  if (ngx_slab_max_size < size) {
    if ((ngx_cycle->log->log_level & 0x20) != 0) {
      ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %uz",size);
    }
    puVar18 = (u_char *)0x0;
    pnVar7 = ngx_slab_alloc_pages
                       (pool,((size >> ((byte)ngx_pagesize_shift & 0x3f)) + 1) -
                             (ulong)(size % ngx_pagesize == 0));
    if (pnVar7 != (ngx_slab_page_t *)0x0) {
      puVar18 = pool->start +
                (((long)pnVar7 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f));
    }
  }
  else {
    if (pool->min_size < size) {
      sVar17 = 1;
      for (uVar8 = size - 1; 1 < uVar8; uVar8 = uVar8 >> 1) {
        sVar17 = sVar17 + 1;
      }
      lVar19 = sVar17 - pool->min_shift;
    }
    else {
      sVar17 = pool->min_shift;
      lVar19 = 0;
    }
    pnVar1 = &pool->stats[lVar19].reqs;
    *pnVar1 = *pnVar1 + 1;
    if ((ngx_cycle->log->log_level & 0x20) != 0) {
      ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %uz slot: %ui",size);
    }
    puVar2 = (ulong *)(&pool[1].min_size)[lVar19 * 3];
    puVar3 = (ulong *)puVar2[1];
    bVar6 = (byte)sVar17;
    if (puVar3 != puVar2) {
      if (sVar17 < ngx_slab_exact_shift) {
        lVar9 = ((long)puVar2 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f);
        puVar4 = pool->start;
        uVar11 = (ngx_pagesize >> (bVar6 & 0x3f)) >> 6;
        lVar10 = 0;
        uVar8 = 1;
        for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
          uVar13 = *(ulong *)(puVar4 + uVar14 * 8 + lVar9);
          if (uVar13 != 0xffffffffffffffff) {
            uVar16 = 1;
            for (lVar20 = 0; lVar20 != 0x40; lVar20 = lVar20 + 1) {
              if ((uVar16 & uVar13) == 0) {
                *(ulong *)(puVar4 + uVar14 * 8 + lVar9) = uVar16 | uVar13;
                pnVar1 = &pool->stats[lVar19].used;
                *pnVar1 = *pnVar1 + 1;
                puVar18 = puVar4 + (lVar20 - lVar10 << (bVar6 & 0x3f)) + lVar9;
                lVar19 = *(long *)(puVar4 + uVar14 * 8 + lVar9);
                goto joined_r0x0011d65d;
              }
              uVar16 = uVar16 * 2;
            }
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + -0x40;
        }
      }
      else if (sVar17 == ngx_slab_exact_shift) {
        uVar8 = 1;
        for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
          if ((*puVar2 & uVar8) == 0) {
            uVar8 = *puVar2 | uVar8;
            *puVar2 = uVar8;
            if (uVar8 == 0xffffffffffffffff) {
              uVar8 = puVar2[2];
              *(ulong **)((uVar8 & 0xfffffffffffffffc) + 8) = puVar3;
              *(ulong *)(puVar2[1] + 0x10) = uVar8;
              puVar2[1] = 0;
              puVar2[2] = 2;
            }
LAB_0011d919:
            puVar18 = pool->start +
                      (((long)puVar2 - (long)pool->pages) / 0x18 <<
                      ((byte)ngx_pagesize_shift & 0x3f)) + (lVar9 << (bVar6 & 0x3f));
            pnVar1 = &pool->stats[lVar19].used;
            *pnVar1 = *pnVar1 + 1;
            goto LAB_0011d94e;
          }
          uVar8 = uVar8 * 2;
        }
      }
      else {
        uVar11 = (ulong)~(uint)(-1L << ((byte)(ngx_pagesize >> (bVar6 & 0x3f)) & 0x3f)) << 0x20;
        lVar9 = 0;
        for (uVar8 = 0x100000000; (uVar8 & uVar11) != 0; uVar8 = uVar8 * 2) {
          uVar14 = *puVar2;
          if ((uVar14 & uVar8) == 0) {
            *puVar2 = uVar14 | uVar8;
            if ((uVar14 & 0xffffffff00000000 | uVar8) == uVar11) {
              uVar8 = puVar2[2];
              *(ulong **)((uVar8 & 0xfffffffffffffffc) + 8) = puVar3;
              *(ulong *)(puVar2[1] + 0x10) = uVar8;
              puVar2[1] = 0;
              puVar2[2] = 1;
            }
            goto LAB_0011d919;
          }
          lVar9 = lVar9 + 1;
        }
      }
      ngx_slab_error(pool,2,"ngx_slab_alloc(): page is busy");
      ngx_debug_point();
    }
    uVar8 = 1;
    pnVar7 = ngx_slab_alloc_pages(pool,1);
    if (pnVar7 == (ngx_slab_page_t *)0x0) {
      pnVar1 = &pool->stats[lVar19].fails;
      *pnVar1 = *pnVar1 + 1;
      puVar18 = (u_char *)0x0;
    }
    else {
      pnVar15 = (ngx_slab_page_t *)(&pool[1].lock + lVar19 * 3);
      if (sVar17 < ngx_slab_exact_shift) {
        lVar9 = ((long)pnVar7 - (long)pool->pages) / 0x18;
        lVar10 = lVar9 << ((byte)ngx_pagesize_shift & 0x3f);
        uVar13 = ngx_pagesize >> (bVar6 & 0x3f);
        puVar18 = pool->start;
        uVar14 = (ulong)(8 << (bVar6 & 0x1f));
        uVar11 = uVar13 / uVar14;
        if (uVar13 < uVar14) {
          uVar11 = uVar8;
        }
        *(long *)(puVar18 + lVar10) = (2L << ((byte)uVar11 & 0x3f)) + -1;
        uVar14 = ngx_pagesize >> (bVar6 & 0x3f);
        for (; uVar8 < uVar14 >> 6; uVar8 = uVar8 + 1) {
          puVar4 = puVar18 + uVar8 * 8 + lVar10;
          puVar4[0] = '\0';
          puVar4[1] = '\0';
          puVar4[2] = '\0';
          puVar4[3] = '\0';
          puVar4[4] = '\0';
          puVar4[5] = '\0';
          puVar4[6] = '\0';
          puVar4[7] = '\0';
        }
        pnVar7->slab = sVar17;
        pnVar7->next = pnVar15;
        pnVar7->prev = (ulong)pnVar15 | 3;
        (&pool[1].min_size)[lVar19 * 3] = (size_t)pnVar7;
        pnVar5 = pool->stats;
        pnVar12 = pnVar5 + lVar19;
        pnVar12->total = pnVar12->total + ((ngx_pagesize >> (bVar6 & 0x3f)) - uVar11);
        puVar18 = puVar18 + (lVar9 << ((byte)ngx_pagesize_shift & 0x3f)) +
                            (uVar11 << (bVar6 & 0x3f));
        pnVar1 = &pnVar5[lVar19].used;
        *pnVar1 = *pnVar1 + 1;
      }
      else {
        if (sVar17 == ngx_slab_exact_shift) {
          pnVar7->slab = 1;
          pnVar7->next = pnVar15;
          pnVar7->prev = (ulong)pnVar15 | 2;
          (&pool[1].min_size)[lVar19 * 3] = (size_t)pnVar7;
          pnVar12 = pool->stats;
          pnVar12[lVar19].total = pnVar12[lVar19].total + 0x40;
        }
        else {
          pnVar7->slab = sVar17 | 0x100000000;
          pnVar7->next = pnVar15;
          pnVar7->prev = (ulong)pnVar15 | 1;
          (&pool[1].min_size)[lVar19 * 3] = (size_t)pnVar7;
          pnVar12 = pool->stats;
          pnVar12[lVar19].total = pnVar12[lVar19].total + (ngx_pagesize >> (bVar6 & 0x3f));
        }
        puVar18 = pool->start +
                  (((long)pnVar7 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f));
        pnVar12[lVar19].used = pnVar12[lVar19].used + 1;
      }
    }
  }
LAB_0011d94e:
  if ((ngx_cycle->log->log_level & 0x20) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %p",puVar18);
  }
  return puVar18;
joined_r0x0011d65d:
  if (lVar19 != -1) goto LAB_0011d94e;
  if (uVar11 <= uVar8) {
    uVar8 = puVar2[2];
    *(ulong **)((uVar8 & 0xfffffffffffffffc) + 8) = puVar3;
    *(ulong *)(puVar2[1] + 0x10) = uVar8;
    puVar2[1] = 0;
    puVar2[2] = 3;
    goto LAB_0011d94e;
  }
  lVar19 = *(long *)(puVar4 + uVar8 * 8 + lVar9);
  uVar8 = uVar8 + 1;
  goto joined_r0x0011d65d;
}

Assistant:

void *
ngx_slab_alloc_locked(ngx_slab_pool_t *pool, size_t size)
{
    size_t            s;
    uintptr_t         p, n, m, mask, *bitmap;
    ngx_uint_t        i, slot, shift, map;
    ngx_slab_page_t  *page, *prev, *slots;

    if (size > ngx_slab_max_size) {

        ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                       "slab alloc: %uz", size);

        page = ngx_slab_alloc_pages(pool, (size >> ngx_pagesize_shift)
                                          + ((size % ngx_pagesize) ? 1 : 0));
        if (page) {
            p = ngx_slab_page_addr(pool, page);

        } else {
            p = 0;
        }

        goto done;
    }

    if (size > pool->min_size) {
        shift = 1;
        for (s = size - 1; s >>= 1; shift++) { /* void */ }
        slot = shift - pool->min_shift;

    } else {
        shift = pool->min_shift;
        slot = 0;
    }

    pool->stats[slot].reqs++;

    ngx_log_debug2(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                   "slab alloc: %uz slot: %ui", size, slot);

    slots = ngx_slab_slots(pool);
    page = slots[slot].next;

    if (page->next != page) {

        if (shift < ngx_slab_exact_shift) {

            bitmap = (uintptr_t *) ngx_slab_page_addr(pool, page);

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (n = 0; n < map; n++) {

                if (bitmap[n] != NGX_SLAB_BUSY) {

                    for (m = 1, i = 0; m; m <<= 1, i++) {
                        if (bitmap[n] & m) {
                            continue;
                        }

                        bitmap[n] |= m;

                        i = (n * sizeof(uintptr_t) * 8 + i) << shift;

                        p = (uintptr_t) bitmap + i;

                        pool->stats[slot].used++;

                        if (bitmap[n] == NGX_SLAB_BUSY) {
                            for (n = n + 1; n < map; n++) {
                                if (bitmap[n] != NGX_SLAB_BUSY) {
                                    goto done;
                                }
                            }

                            prev = ngx_slab_page_prev(page);
                            prev->next = page->next;
                            page->next->prev = page->prev;

                            page->next = NULL;
                            page->prev = NGX_SLAB_SMALL;
                        }

                        goto done;
                    }
                }
            }

        } else if (shift == ngx_slab_exact_shift) {

            for (m = 1, i = 0; m; m <<= 1, i++) {
                if (page->slab & m) {
                    continue;
                }

                page->slab |= m;

                if (page->slab == NGX_SLAB_BUSY) {
                    prev = ngx_slab_page_prev(page);
                    prev->next = page->next;
                    page->next->prev = page->prev;

                    page->next = NULL;
                    page->prev = NGX_SLAB_EXACT;
                }

                p = ngx_slab_page_addr(pool, page) + (i << shift);

                pool->stats[slot].used++;

                goto done;
            }

        } else { /* shift > ngx_slab_exact_shift */

            mask = ((uintptr_t) 1 << (ngx_pagesize >> shift)) - 1;
            mask <<= NGX_SLAB_MAP_SHIFT;

            for (m = (uintptr_t) 1 << NGX_SLAB_MAP_SHIFT, i = 0;
                 m & mask;
                 m <<= 1, i++)
            {
                if (page->slab & m) {
                    continue;
                }

                page->slab |= m;

                if ((page->slab & NGX_SLAB_MAP_MASK) == mask) {
                    prev = ngx_slab_page_prev(page);
                    prev->next = page->next;
                    page->next->prev = page->prev;

                    page->next = NULL;
                    page->prev = NGX_SLAB_BIG;
                }

                p = ngx_slab_page_addr(pool, page) + (i << shift);

                pool->stats[slot].used++;

                goto done;
            }
        }

        ngx_slab_error(pool, NGX_LOG_ALERT, "ngx_slab_alloc(): page is busy");
        ngx_debug_point();
    }

    page = ngx_slab_alloc_pages(pool, 1);

    if (page) {
        if (shift < ngx_slab_exact_shift) {
            bitmap = (uintptr_t *) ngx_slab_page_addr(pool, page);

            n = (ngx_pagesize >> shift) / ((1 << shift) * 8);

            if (n == 0) {
                n = 1;
            }

            /* "n" elements for bitmap, plus one requested */
            bitmap[0] = ((uintptr_t) 2 << n) - 1;

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (i = 1; i < map; i++) {
                bitmap[i] = 0;
            }

            page->slab = shift;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_SMALL;

            slots[slot].next = page;

            pool->stats[slot].total += (ngx_pagesize >> shift) - n;

            p = ngx_slab_page_addr(pool, page) + (n << shift);

            pool->stats[slot].used++;

            goto done;

        } else if (shift == ngx_slab_exact_shift) {

            page->slab = 1;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_EXACT;

            slots[slot].next = page;

            pool->stats[slot].total += sizeof(uintptr_t) * 8;

            p = ngx_slab_page_addr(pool, page);

            pool->stats[slot].used++;

            goto done;

        } else { /* shift > ngx_slab_exact_shift */

            page->slab = ((uintptr_t) 1 << NGX_SLAB_MAP_SHIFT) | shift;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_BIG;

            slots[slot].next = page;

            pool->stats[slot].total += ngx_pagesize >> shift;

            p = ngx_slab_page_addr(pool, page);

            pool->stats[slot].used++;

            goto done;
        }
    }

    p = 0;

    pool->stats[slot].fails++;

done:

    ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                   "slab alloc: %p", (void *) p);

    return (void *) p;
}